

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.cxx
# Opt level: O0

bool cmTargetPropertyComputer::WhiteListedInterfaceProperty(string *prop)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f4;
  key_equal local_1f3;
  hasher local_1f2;
  undefined1 local_1f1;
  allocator<char> local_1f0;
  allocator<char> local_1ef;
  allocator<char> local_1ee;
  allocator<char> local_1ed;
  allocator<char> local_1ec;
  allocator<char> local_1eb;
  allocator<char> local_1ea;
  allocator<char> local_1e9;
  allocator<char> local_1e8;
  allocator<char> local_1e7;
  allocator<char> local_1e6;
  allocator<char> local_1e5 [20];
  allocator<char> local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  iterator local_28;
  size_type local_20;
  undefined1 local_18 [8];
  string *prop_local;
  
  local_18 = (undefined1  [8])prop;
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,11ul>(prop,(char (*) [11])0x89fa2f);
  if ((!bVar1) &&
     (bVar1 = cmHasLiteralPrefix<std::__cxx11::string,2ul>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_18,(char (*) [2])0x8b6515), !bVar1)) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    iVar2 = islower((int)*pcVar3);
    if (iVar2 == 0) {
      if ((WhiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_ == '\0')
         && (iVar2 = __cxa_guard_acquire(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)
                                          ::builtIns_abi_cxx11_), iVar2 != 0)) {
        local_1f1 = 1;
        local_1d0 = &local_1c8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c8,"COMPATIBLE_INTERFACE_BOOL",&local_1d1);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1a8,"COMPATIBLE_INTERFACE_NUMBER_MAX",local_1e5);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_188,"COMPATIBLE_INTERFACE_NUMBER_MIN",&local_1e6);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_168,"COMPATIBLE_INTERFACE_STRING",&local_1e7);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_148,"EXPORT_NAME",&local_1e8);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_128,"EXPORT_PROPERTIES",&local_1e9)
        ;
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_108,"IMPORTED",&local_1ea);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_e8,"IMPORTED_GLOBAL",&local_1eb);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_c8,"MANUALLY_ADDED_DEPENDENCIES",&local_1ec);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_a8,"NAME",&local_1ed);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_88,"PRIVATE_HEADER",&local_1ee);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_68,"PUBLIC_HEADER",&local_1ef);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_48,"TYPE",&local_1f0);
        local_1f1 = 0;
        local_28 = &local_1c8;
        local_20 = 0xd;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_1f4);
        __l._M_len = local_20;
        __l._M_array = local_28;
        std::
        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::unordered_set(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                         builtIns_abi_cxx11_,__l,0,&local_1f2,&local_1f3,&local_1f4);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_1f4);
        local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28;
        do {
          local_2d8 = local_2d8 + -1;
          std::__cxx11::string::~string((string *)local_2d8);
        } while (local_2d8 != &local_1c8);
        std::allocator<char>::~allocator(&local_1f0);
        std::allocator<char>::~allocator(&local_1ef);
        std::allocator<char>::~allocator(&local_1ee);
        std::allocator<char>::~allocator(&local_1ed);
        std::allocator<char>::~allocator(&local_1ec);
        std::allocator<char>::~allocator(&local_1eb);
        std::allocator<char>::~allocator(&local_1ea);
        std::allocator<char>::~allocator(&local_1e9);
        std::allocator<char>::~allocator(&local_1e8);
        std::allocator<char>::~allocator(&local_1e7);
        std::allocator<char>::~allocator(&local_1e6);
        std::allocator<char>::~allocator(local_1e5);
        std::allocator<char>::~allocator(&local_1d1);
        __cxa_atexit(std::
                     unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::~unordered_set,
                     &WhiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_
                     ,&__dso_handle);
        __cxa_guard_release(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                             builtIns_abi_cxx11_);
      }
      sVar4 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                       builtIns_abi_cxx11_,(key_type *)local_18);
      if ((((sVar4 == 0) &&
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_18,"IMPORTED_CONFIGURATIONS"), !bVar1)) &&
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_18,"IMPORTED_LIBNAME"), !bVar1)) &&
         ((bVar1 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_18,(char (*) [18])"IMPORTED_LIBNAME_"), !bVar1 &&
          (bVar1 = cmHasLiteralPrefix<std::__cxx11::string,21ul>
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_18,(char (*) [21])"MAP_IMPORTED_CONFIG_"), !bVar1)))) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_18,"NO_SYSTEM_FROM_IMPORTED");
        if (bVar1) {
          return true;
        }
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool cmTargetPropertyComputer::WhiteListedInterfaceProperty(
  const std::string& prop)
{
  if (cmHasLiteralPrefix(prop, "INTERFACE_")) {
    return true;
  }
  if (cmHasLiteralPrefix(prop, "_")) {
    return true;
  }
  if (std::islower(prop[0])) {
    return true;
  }
  static std::unordered_set<std::string> const builtIns{
    "COMPATIBLE_INTERFACE_BOOL",
    "COMPATIBLE_INTERFACE_NUMBER_MAX",
    "COMPATIBLE_INTERFACE_NUMBER_MIN",
    "COMPATIBLE_INTERFACE_STRING",
    "EXPORT_NAME",
    "EXPORT_PROPERTIES",
    "IMPORTED",
    "IMPORTED_GLOBAL",
    "MANUALLY_ADDED_DEPENDENCIES",
    "NAME",
    "PRIVATE_HEADER",
    "PUBLIC_HEADER",
    "TYPE"
  };

  if (builtIns.count(prop)) {
    return true;
  }

  if (prop == "IMPORTED_CONFIGURATIONS" || prop == "IMPORTED_LIBNAME" ||
      cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME_") ||
      cmHasLiteralPrefix(prop, "MAP_IMPORTED_CONFIG_")) {
    return true;
  }

  // This property should not be allowed but was incorrectly added in
  // CMake 3.8.  We can't remove it from the whitelist without breaking
  // projects that try to set it.  One day we could warn about this, but
  // for now silently accept it.
  if (prop == "NO_SYSTEM_FROM_IMPORTED") {
    return true;
  }

  return false;
}